

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

PReLUParameter * __thiscall caffe::PReLUParameter::New(PReLUParameter *this,Arena *arena)

{
  PReLUParameter *this_00;
  
  this_00 = (PReLUParameter *)operator_new(0x28);
  PReLUParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::PReLUParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

PReLUParameter* PReLUParameter::New(::google::protobuf::Arena* arena) const {
  PReLUParameter* n = new PReLUParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}